

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

bool __thiscall helics::TimeDependencies::addDependent(TimeDependencies *this,GlobalFederateId gid)

{
  bool bVar1;
  DependencyInfo *pDVar2;
  DependencyInfo *pDVar3;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __position;
  iterator iVar4;
  GlobalFederateId local_1c;
  
  pDVar2 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_1c.gid = gid.gid;
  if ((pDVar2 == pDVar3) ||
     (__position = std::
                   lower_bound<__gnu_cxx::__normal_iterator<helics::DependencyInfo*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::GlobalFederateId,helics::__0>
                             (pDVar2,pDVar3,&local_1c), __position._M_current == pDVar3)) {
    std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
    emplace_back<helics::GlobalFederateId&>
              ((vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>> *)this,
               &local_1c);
    (this->dependencies).
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].dependent = true;
  }
  else {
    if (((__position._M_current)->fedID).gid == gid.gid) {
      bVar1 = (__position._M_current)->dependent;
      (__position._M_current)->dependent = true;
      return (bool)(bVar1 ^ 1);
    }
    iVar4 = std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
            _M_emplace_aux<helics::GlobalFederateId&>
                      ((vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>> *)this
                       ,__position._M_current,&local_1c);
    (iVar4._M_current)->dependent = true;
  }
  return true;
}

Assistant:

bool TimeDependencies::addDependent(GlobalFederateId gid)

{
    if (dependencies.empty()) {
        dependencies.emplace_back(gid);
        dependencies.back().dependent = true;
        return true;
    }
    auto dep = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if (dep == dependencies.end()) {
        dependencies.emplace_back(gid);
        dependencies.back().dependent = true;
    } else {
        if (dep->fedID == gid) {
            auto rval = dep->dependent;
            dep->dependent = true;
            // the dependency is already present
            return !rval;
        }
        auto dependencyIterator = dependencies.emplace(dep, gid);
        dependencyIterator->dependent = true;
    }
    return true;
}